

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O0

axbStatus_t axbVecMAXPY(axbVec_s *y,size_t num_vecs,axbScalar_s **alpha,axbVec_s **x)

{
  _func_axbStatus_t_axbVec_s_ptr_size_t_axbScalar_s_ptr_ptr_axbVec_s_ptr_ptr_void_ptr *op;
  axbOpDescriptor_t op_desc;
  size_t i;
  axbVec_s **x_local;
  axbScalar_s **alpha_local;
  size_t num_vecs_local;
  axbVec_s *y_local;
  
  if (y->init == 0x1d232) {
    op_desc.id = 0;
    op_desc._52_4_ = 0;
    for (; (ulong)op_desc._48_8_ < num_vecs; op_desc._48_8_ = op_desc._48_8_ + 1) {
      if (x[op_desc._48_8_]->init != 0x1d232) {
        fprintf(_stderr,"Vector not fully initialized!\n");
        return 0x1d232;
      }
    }
    memcpy(&op,y->opBackend->op_table + 0x14,0x38);
    (*op)(y,num_vecs,alpha,x,op_desc.func);
    y_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"Vector not fully initialized!\n");
    y_local._4_4_ = 0x1d232;
  }
  return y_local._4_4_;
}

Assistant:

axbStatus_t axbVecMAXPY(struct axbVec_s *y, size_t num_vecs, const struct axbScalar_s * const *alpha, const struct axbVec_s * const *x)
{
  AXB_VECTOR_INIT_CHECK(y);
  for (size_t i=0; i<num_vecs; ++i) AXB_VECTOR_INIT_CHECK(x[i]);

  axbOpDescriptor_t op_desc = y->opBackend->op_table[AXB_OP_VEC_MAXPY];
  axbStatus_t (*op)(struct axbVec_s *, size_t, const struct axbScalar_s * const *, const struct axbVec_s * const *, void*) = (axbStatus_t (*)(struct axbVec_s *, size_t, const struct axbScalar_s * const *, const struct axbVec_s * const *, void*)) op_desc.func;
  op(y, num_vecs, alpha, x, op_desc.func_data);
  return 0;
}